

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.hpp
# Opt level: O1

void __thiscall
OpenMD::Quaternion<double>::toTwistSwing(Quaternion<double> *this,double *tw,double *sx,double *sy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 local_48;
  double local_38;
  double dStack_30;
  
  dVar1 = (this->super_Vector<double,_4U>).data_[3];
  if ((1e-06 <= ABS(dVar1)) || (1e-06 <= ABS((this->super_Vector<double,_4U>).data_[0]))) {
    dVar2 = (this->super_Vector<double,_4U>).data_[0];
    uVar6 = SUB84(dVar2,0);
    uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
    if (0.0 <= dVar2) {
      local_38 = (this->super_Vector<double,_4U>).data_[1];
      dStack_30 = (this->super_Vector<double,_4U>).data_[2];
    }
    else {
      uVar8 = (ulong)DAT_002969e0;
      uVar6 = (undefined4)((ulong)dVar2 ^ uVar8);
      uVar7 = (undefined4)(((ulong)dVar2 ^ uVar8) >> 0x20);
      local_38 = (double)((ulong)(this->super_Vector<double,_4U>).data_[1] ^ uVar8);
      dStack_30 = (double)((ulong)(this->super_Vector<double,_4U>).data_[2] ^ DAT_002969e0._8_8_);
      dVar1 = (double)((ulong)dVar1 ^ uVar8);
    }
    local_48 = (double)CONCAT44(uVar7,uVar6);
    dVar2 = atan2(dVar1,(double)CONCAT44(uVar7,uVar6));
    dVar3 = local_38 * local_38 + dStack_30 * dStack_30;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar1 = dVar1 * dVar1 + local_48 * local_48;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar1 = atan2(dVar3,dVar1);
    dVar3 = sin(dVar1);
    dVar4 = 0.0;
    dVar5 = 0.0;
    if (1e-06 <= ABS(dVar3)) {
      dVar4 = sin(dVar2);
      dVar5 = cos(dVar2);
      auVar9._8_8_ = dVar5 * local_38 + dVar4 * dStack_30;
      auVar9._0_8_ = dVar4 * -local_38 + dVar5 * dStack_30;
      auVar10._8_8_ = dVar3;
      auVar10._0_8_ = dVar3;
      auVar10 = divpd(auVar9,auVar10);
      dVar4 = auVar10._0_8_ + auVar10._0_8_;
      dVar5 = auVar10._8_8_ + auVar10._8_8_;
    }
    *tw = dVar2 + dVar2;
    *sx = dVar5 * dVar1;
    *sy = dVar1 * dVar4;
  }
  else {
    *sy = 3.141592653589793;
    *sx = 3.141592653589793;
    *tw = 0.0;
  }
  return;
}

Assistant:

void toTwistSwing(Real& tw, Real& sx, Real& sy) {
      // First test if the swing is in the singularity:

      if (ISZERO(z(), tiny) && ISZERO(w(), tiny)) {
        sx = sy = Constants::PI;
        tw      = 0;
        return;
      }

      // Decompose into twist-swing by solving the equation:
      //
      //                       Qtwist(t*2) * Qswing(s*2) = q
      //
      // note: (x,y) is the normalized swing axis (x*x+y*y=1)
      //
      //          ( Ct 0 0 St ) * ( Cs xSs ySs 0 ) = ( qw qx qy qz )
      //  ( CtCs  xSsCt-yStSs  xStSs+ySsCt  StCs ) = ( qw qx qy qz )      (1)
      // From (1): CtCs / StCs = qw/qz => Ct/St = qw/qz => tan(t) = qz/qw (2)
      //
      // The swing rotation/2 s comes from:
      //
      // From (1): (CtCs)^2 + (StCs)^2 = qw^2 + qz^2 =>
      //                                       Cs = sqrt ( qw^2 + qz^2 ) (3)
      //
      // From (1): (xSsCt-yStSs)^2 + (xStSs+ySsCt)^2 = qx^2 + qy^2 =>
      //                                       Ss = sqrt ( qx^2 + qy^2 ) (4)
      // From (1):  |SsCt -StSs| |x| = |qx|
      //            |StSs +SsCt| |y|   |qy|                              (5)

      Real qw, qx, qy, qz;

      if (w() < 0) {
        qw = -w();
        qx = -x();
        qy = -y();
        qz = -z();
      } else {
        qw = w();
        qx = x();
        qy = y();
        qz = z();
      }

      Real t = atan2(qz, qw);  // from (2)
      Real s =
          atan2(sqrt(qx * qx + qy * qy), sqrt(qz * qz + qw * qw));  // from (3)
                                                                    // and (4)

      Real x = 0.0, y = 0.0, sins = sin(s);

      if (!ISZERO(sins, tiny)) {
        Real sint = sin(t);
        Real cost = cos(t);

        // by solving the linear system in (5):
        y = (-qx * sint + qy * cost) / sins;
        x = (qx * cost + qy * sint) / sins;
      }

      tw = (Real)2.0 * t;
      sx = (Real)2.0 * x * s;
      sy = (Real)2.0 * y * s;
    }